

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.cpp
# Opt level: O2

idx_t duckdb::RegexpStringSplit::Find
                (char *input_data,idx_t input_size,char *delim_data,idx_t delim_size,
                idx_t *match_size,void *data)

{
  idx_t iVar1;
  InvalidInputException *this;
  StringPiece local_d8;
  RE2 regex;
  
  local_d8.data_ = delim_data;
  local_d8.size_ = delim_size;
  duckdb_re2::RE2::RE2(&regex,&local_d8);
  if ((regex._68_4_ & 0x1fffffff) == 0) {
    iVar1 = ConstantRegexpStringSplit::Find
                      (input_data,input_size,delim_data,delim_size,match_size,&regex);
    duckdb_re2::RE2::~RE2(&regex);
    return iVar1;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this,regex.error_);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static idx_t Find(const char *input_data, idx_t input_size, const char *delim_data, idx_t delim_size,
	                  idx_t &match_size, void *data) {
		duckdb_re2::RE2 regex(duckdb_re2::StringPiece(delim_data, delim_size));
		if (!regex.ok()) {
			throw InvalidInputException(regex.error());
		}
		return ConstantRegexpStringSplit::Find(input_data, input_size, delim_data, delim_size, match_size, &regex);
	}